

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcLine::IfcLine(IfcLine *this)

{
  IfcLine *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x50,"IfcLine");
  IfcCurve::IfcCurve(&this->super_IfcCurve,&PTR_construction_vtable_24__00f9bbd8);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcLine,_2UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcLine,_2UL> *)
             &(this->super_IfcCurve).super_IfcGeometricRepresentationItem.field_0x30,
             &PTR_construction_vtable_24__00f9bc50);
  (this->super_IfcCurve).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0xf9bb20;
  *(undefined8 *)&this->field_0x50 = 0xf9bbc0;
  *(undefined8 *)
   &(this->super_IfcCurve).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0xf9bb48;
  *(undefined8 *)
   &(this->super_IfcCurve).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0xf9bb70;
  *(undefined8 *)&(this->super_IfcCurve).super_IfcGeometricRepresentationItem.field_0x30 = 0xf9bb98;
  STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>::Lazy
            ((Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint> *)&(this->super_IfcCurve).field_0x40,
             (LazyObject *)0x0);
  STEP::Lazy<Assimp::IFC::Schema_2x3::IfcVector>::Lazy(&this->Dir,(LazyObject *)0x0);
  return;
}

Assistant:

IfcLine() : Object("IfcLine") {}